

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O3

void __thiscall
Inject::ctor_inject::ctor_inject
          (ctor_inject *this,type *service1,type *service2,type *service3,type *service4,
          type *service5,type service6,type service7)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long lVar2;
  unique_id local_1d0;
  unique_id *local_1c8;
  long *local_1c0;
  long local_1b8;
  undefined **local_1b0;
  undefined1 local_1a8;
  undefined8 *local_1a0;
  char *local_198;
  undefined **local_190;
  undefined1 local_188;
  undefined8 *local_180;
  unique_id **local_178;
  undefined **local_170;
  undefined1 local_168;
  undefined8 *local_160;
  long **local_158;
  undefined1 local_150 [8];
  undefined8 local_148;
  shared_count sStack_140;
  char *local_138;
  char *local_130;
  type *local_128;
  type *local_120;
  type *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  this->ctor_num = 7;
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = service3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x28f);
  local_1a8 = 0;
  local_1b0 = &PTR__lazy_ostream_00163f68;
  local_1a0 = &boost::unit_test::lazy_ostream::inst;
  local_198 = "";
  if (service1->px != (element_type *)0x0) {
    iVar1 = (**service1->px->_vptr_service)();
    local_1b8 = CONCAT44(extraout_var,iVar1);
    local_128 = service5;
    local_120 = service4;
    local_1d0 = inject::id_of<Inject::impl1>::id();
    local_1c8 = &local_1d0;
    local_1c0 = &local_1b8;
    local_150[0] = local_1b8 == local_1d0;
    local_148 = 0;
    sStack_140.pi_ = (sp_counted_base *)0x0;
    local_138 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
    ;
    local_130 = "";
    local_158 = &local_1c0;
    local_168 = 0;
    local_170 = &PTR__lazy_ostream_00163fb8;
    local_160 = &boost::unit_test::lazy_ostream::inst;
    local_178 = &local_1c8;
    local_188 = 0;
    local_190 = &PTR__lazy_ostream_00163fb8;
    local_180 = &boost::unit_test::lazy_ostream::inst;
    boost::test_tools::tt_detail::report_assertion
              (local_150,&local_1b0,&local_138,0x28f,1,2,2,"service1->id()",&local_170,
               "id_of<impl1>::id()",&local_190);
    boost::detail::shared_count::~shared_count(&sStack_140);
    local_60 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
    ;
    local_58 = "";
    local_70 = &boost::unit_test::basic_cstring<char_const>::null;
    local_68 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x290);
    local_1a8 = 0;
    local_1b0 = &PTR__lazy_ostream_00163f68;
    local_1a0 = &boost::unit_test::lazy_ostream::inst;
    local_198 = "";
    if (service2->px != (element_type *)0x0) {
      iVar1 = (**service2->px->_vptr_service)();
      local_1b8 = CONCAT44(extraout_var_00,iVar1);
      local_1d0 = inject::id_of<Inject::impl1>::id();
      local_150[0] = local_1b8 == local_1d0;
      local_148 = 0;
      sStack_140.pi_ = (sp_counted_base *)0x0;
      local_138 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
      ;
      local_130 = "";
      local_168 = 0;
      local_170 = &PTR__lazy_ostream_00163fb8;
      local_160 = &boost::unit_test::lazy_ostream::inst;
      local_158 = &local_1c0;
      local_1c8 = &local_1d0;
      local_188 = 0;
      local_190 = &PTR__lazy_ostream_00163fb8;
      local_180 = &boost::unit_test::lazy_ostream::inst;
      local_178 = &local_1c8;
      local_1c0 = &local_1b8;
      boost::test_tools::tt_detail::report_assertion
                (local_150,&local_1b0,&local_138,0x290,1,2,2,"service2->id()",&local_170,
                 "id_of<impl1>::id()",&local_190);
      boost::detail::shared_count::~shared_count(&sStack_140);
      local_80 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
      ;
      local_78 = "";
      local_90 = &boost::unit_test::basic_cstring<char_const>::null;
      local_88 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x291);
      local_1a8 = 0;
      local_1b0 = &PTR__lazy_ostream_00163f68;
      local_1a0 = &boost::unit_test::lazy_ostream::inst;
      local_198 = "";
      if (local_118->px != (element_type *)0x0) {
        iVar1 = (**local_118->px->_vptr_service)();
        local_1b8 = CONCAT44(extraout_var_01,iVar1);
        local_1d0 = inject::id_of<Inject::impl1>::id();
        local_150[0] = local_1b8 == local_1d0;
        local_148 = 0;
        sStack_140.pi_ = (sp_counted_base *)0x0;
        local_138 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
        ;
        local_130 = "";
        local_168 = 0;
        local_170 = &PTR__lazy_ostream_00163fb8;
        local_160 = &boost::unit_test::lazy_ostream::inst;
        local_158 = &local_1c0;
        local_1c8 = &local_1d0;
        local_188 = 0;
        local_190 = &PTR__lazy_ostream_00163fb8;
        local_180 = &boost::unit_test::lazy_ostream::inst;
        local_178 = &local_1c8;
        local_1c0 = &local_1b8;
        boost::test_tools::tt_detail::report_assertion
                  (local_150,&local_1b0,&local_138,0x291,1,2,2,"service3->id()",&local_170,
                   "id_of<impl1>::id()",&local_190);
        boost::detail::shared_count::~shared_count(&sStack_140);
        local_a0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
        ;
        local_98 = "";
        local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x292);
        local_1a8 = 0;
        local_1b0 = &PTR__lazy_ostream_00163f68;
        local_1a0 = &boost::unit_test::lazy_ostream::inst;
        local_198 = "";
        if (local_120->px != (element_type *)0x0) {
          iVar1 = (**local_120->px->_vptr_service)();
          local_1b8 = CONCAT44(extraout_var_02,iVar1);
          local_1d0 = inject::id_of<Inject::impl1>::id();
          local_150[0] = local_1b8 == local_1d0;
          local_148 = 0;
          sStack_140.pi_ = (sp_counted_base *)0x0;
          local_138 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
          ;
          local_130 = "";
          local_168 = 0;
          local_170 = &PTR__lazy_ostream_00163fb8;
          local_160 = &boost::unit_test::lazy_ostream::inst;
          local_158 = &local_1c0;
          local_1c8 = &local_1d0;
          local_188 = 0;
          local_190 = &PTR__lazy_ostream_00163fb8;
          local_180 = &boost::unit_test::lazy_ostream::inst;
          local_178 = &local_1c8;
          local_1c0 = &local_1b8;
          boost::test_tools::tt_detail::report_assertion
                    (local_150,&local_1b0,&local_138,0x292,1,2,2,"service4->id()",&local_170,
                     "id_of<impl1>::id()",&local_190);
          boost::detail::shared_count::~shared_count(&sStack_140);
          local_c0 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
          ;
          local_b8 = "";
          local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
          local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x293);
          local_1a8 = 0;
          local_1b0 = &PTR__lazy_ostream_00163f68;
          local_1a0 = &boost::unit_test::lazy_ostream::inst;
          local_198 = "";
          if (local_128->px != (element_type *)0x0) {
            iVar1 = (**local_128->px->_vptr_service)();
            local_1b8 = CONCAT44(extraout_var_03,iVar1);
            local_1d0 = inject::id_of<Inject::impl1>::id();
            local_150[0] = CONCAT44(extraout_var_03,iVar1) == local_1d0;
            local_148 = 0;
            sStack_140.pi_ = (sp_counted_base *)0x0;
            local_138 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
            ;
            local_130 = "";
            local_168 = 0;
            local_170 = &PTR__lazy_ostream_00163fb8;
            local_160 = &boost::unit_test::lazy_ostream::inst;
            local_158 = &local_1c0;
            local_1c8 = &local_1d0;
            local_188 = 0;
            local_190 = &PTR__lazy_ostream_00163fb8;
            local_180 = &boost::unit_test::lazy_ostream::inst;
            local_178 = &local_1c8;
            local_1c0 = &local_1b8;
            boost::test_tools::tt_detail::report_assertion
                      (local_150,&local_1b0,&local_138,0x293,1,2,2,"service5->id()",&local_170,
                       "id_of<impl1>::id()",&local_190);
            boost::detail::shared_count::~shared_count(&sStack_140);
            local_e0 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
            ;
            local_d8 = "";
            local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
            local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x294);
            local_1a8 = 0;
            local_1b0 = &PTR__lazy_ostream_00163f68;
            local_1a0 = &boost::unit_test::lazy_ostream::inst;
            local_198 = "";
            if ((service6.px)->_vptr_service != (_func_int **)0x0) {
              lVar2 = (**(code **)*(service6.px)->_vptr_service)();
              local_1b8 = lVar2;
              local_1d0 = inject::id_of<Inject::impl1>::id();
              local_150[0] = lVar2 == local_1d0;
              local_148 = 0;
              sStack_140.pi_ = (sp_counted_base *)0x0;
              local_138 = 
              "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
              ;
              local_130 = "";
              local_168 = 0;
              local_170 = &PTR__lazy_ostream_00163fb8;
              local_160 = &boost::unit_test::lazy_ostream::inst;
              local_158 = &local_1c0;
              local_1c8 = &local_1d0;
              local_188 = 0;
              local_190 = &PTR__lazy_ostream_00163fb8;
              local_180 = &boost::unit_test::lazy_ostream::inst;
              local_178 = &local_1c8;
              local_1c0 = &local_1b8;
              boost::test_tools::tt_detail::report_assertion
                        (local_150,&local_1b0,&local_138,0x294,1,2,2,"service6->id()",&local_170,
                         "id_of<impl1>::id()",&local_190);
              boost::detail::shared_count::~shared_count(&sStack_140);
              local_100 = 
              "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
              ;
              local_f8 = "";
              local_110 = &boost::unit_test::basic_cstring<char_const>::null;
              local_108 = &boost::unit_test::basic_cstring<char_const>::null;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x295);
              local_1a8 = 0;
              local_1b0 = &PTR__lazy_ostream_00163f68;
              local_1a0 = &boost::unit_test::lazy_ostream::inst;
              local_198 = "";
              if ((service6.pn.pi_)->_vptr_sp_counted_base != (_func_int **)0x0) {
                lVar2 = (**(code **)*(service6.pn.pi_)->_vptr_sp_counted_base)();
                local_1b8 = lVar2;
                local_1d0 = inject::id_of<Inject::impl1>::id();
                local_150[0] = lVar2 == local_1d0;
                local_148 = 0;
                sStack_140.pi_ = (sp_counted_base *)0x0;
                local_138 = 
                "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
                ;
                local_130 = "";
                local_168 = 0;
                local_170 = &PTR__lazy_ostream_00163fb8;
                local_160 = &boost::unit_test::lazy_ostream::inst;
                local_158 = &local_1c0;
                local_1c8 = &local_1d0;
                local_188 = 0;
                local_190 = &PTR__lazy_ostream_00163fb8;
                local_180 = &boost::unit_test::lazy_ostream::inst;
                local_178 = &local_1c8;
                local_1c0 = &local_1b8;
                boost::test_tools::tt_detail::report_assertion
                          (local_150,&local_1b0,&local_138,0x295,1,2,2,"service7->id()",&local_170,
                           "id_of<impl1>::id()",&local_190);
                boost::detail::shared_count::~shared_count(&sStack_140);
                return;
              }
            }
          }
        }
      }
    }
  }
  local_198 = "";
  local_1a0 = &boost::unit_test::lazy_ostream::inst;
  local_1a8 = 0;
  local_1b0 = &PTR__lazy_ostream_00163f68;
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<Inject::service>::operator->() const [T = Inject::service]"
               );
}

Assistant:

ctor_inject(
            context<>::ptr<service>::type service1,
            context<>::ptr<service>::type service2,
            context<>::ptr<service>::type service3,
            context<>::ptr<service>::type service4,
            context<>::ptr<service>::type service5,
            context<>::ptr<service>::type service6,
            context<>::ptr<service>::type service7) {
        ctor_num = 7;
        BOOST_CHECK_EQUAL(service1->id(), id_of<impl1>::id());
        BOOST_CHECK_EQUAL(service2->id(), id_of<impl1>::id());
        BOOST_CHECK_EQUAL(service3->id(), id_of<impl1>::id());
        BOOST_CHECK_EQUAL(service4->id(), id_of<impl1>::id());
        BOOST_CHECK_EQUAL(service5->id(), id_of<impl1>::id());
        BOOST_CHECK_EQUAL(service6->id(), id_of<impl1>::id());
        BOOST_CHECK_EQUAL(service7->id(), id_of<impl1>::id());
    }